

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_CorrelationMeter.cpp
# Opt level: O0

int CorrelationMeter::CreateCallback(UnityAudioEffectState *state)

{
  EffectData *this;
  int local_28;
  int i;
  EffectData *data;
  UnityAudioEffectState *state_local;
  
  this = (EffectData *)operator_new(0x90);
  EffectData::EffectData(this);
  memset(this,0,0x90);
  InitParametersFromDefinitions(InternalRegisterEffectDefinition,(float *)this);
  (state->field_0).field_0.effectdata = this;
  for (local_28 = 0; local_28 < 8; local_28 = local_28 + 1) {
    HistoryBuffer::Init((HistoryBuffer *)(this->p + (long)local_28 * 4 + 2),
                        (state->field_0).field_0.samplerate << 1);
  }
  return 0;
}

Assistant:

UNITY_AUDIODSP_RESULT UNITY_AUDIODSP_CALLBACK CreateCallback(UnityAudioEffectState* state)
    {
        EffectData* data = new EffectData;
        memset(data, 0, sizeof(EffectData));
        InitParametersFromDefinitions(InternalRegisterEffectDefinition, data->p);
        state->effectdata = data;
        for (int i = 0; i < 8; i++)
            data->history[i].Init(state->samplerate * 2);
        return UNITY_AUDIODSP_OK;
    }